

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O0

bool __thiscall
sptk::SpectrumToSpectrum::Run
          (SpectrumToSpectrum *this,vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_iterator __first;
  iterator __last;
  reference ppOVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<sptk::SpectrumToSpectrum::OperationInterface_*const_*,_std::vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>_>
  *in_RDI;
  const_iterator itr;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  __normal_iterator<sptk::SpectrumToSpectrum::OperationInterface_*const_*,_std::vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>_>
  local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  iVar5 = *(int *)&in_RDI[1]._M_current / 2 + 1;
  if (((((ulong)in_RDI[8]._M_current & 1) != 0) &&
      (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar3 == (long)iVar5)) &&
     (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar3 != (long)iVar5) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8._M_current);
    }
    if (in_RSI != in_RDX) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
      __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff98);
      __last = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff98);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __first._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __last._M_current,in_stack_ffffffffffffffb8);
    }
    local_50._M_current =
         (OperationInterface **)
         std::
         vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
         ::begin((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                  *)in_stack_ffffffffffffff98);
    while( true ) {
      std::
      vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
      ::end((vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
             *)in_stack_ffffffffffffff98);
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<sptk::SpectrumToSpectrum::OperationInterface_*const_*,_std::vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>_>
                                 *)in_stack_ffffffffffffff98);
      if (!bVar1) {
        return true;
      }
      ppOVar4 = __gnu_cxx::
                __normal_iterator<sptk::SpectrumToSpectrum::OperationInterface_*const_*,_std::vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>_>
                ::operator*(&local_50);
      uVar2 = (*(*ppOVar4)->_vptr_OperationInterface[2])(*ppOVar4,in_RDX);
      if ((uVar2 & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<sptk::SpectrumToSpectrum::OperationInterface_*const_*,_std::vector<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>_>
      ::operator++(&local_50);
    }
    return false;
  }
  return false;
}

Assistant:

bool SpectrumToSpectrum::Run(const std::vector<double>& input,
                             std::vector<double>* output) const {
  // Check inputs.
  const int length(fft_length_ / 2 + 1);
  if (!is_valid_ || input.size() != static_cast<std::size_t>(length) ||
      NULL == output) {
    return false;
  }

  // Prepare memories.
  if (output->size() != static_cast<std::size_t>(length)) {
    output->resize(length);
  }

  if (&input != output) {
    std::copy(input.begin(), input.end(), output->begin());
  }

  for (std::vector<SpectrumToSpectrum::OperationInterface*>::const_iterator itr(
           operations_.begin());
       itr != operations_.end(); ++itr) {
    if (!(*itr)->Run(output)) {
      return false;
    }
  }

  return true;
}